

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

char * kvtree_get_val(kvtree *hash,char *key)

{
  kvtree_elem *pkVar1;
  ulong uVar2;
  kvtree_struct *pkVar3;
  kvtree_elem_struct *pkVar4;
  
  pkVar1 = kvtree_elem_get(hash,key);
  if (pkVar1 == (kvtree_elem *)0x0) {
    pkVar3 = (kvtree_struct *)0x0;
  }
  else {
    pkVar3 = pkVar1->hash;
  }
  uVar2 = 0;
  if (pkVar3 != (kvtree_struct *)0x0) {
    pkVar4 = pkVar3->lh_first;
    if (pkVar4 != (kvtree_elem_struct *)0x0) {
      uVar2 = 0;
      do {
        uVar2 = (ulong)((int)uVar2 + 1);
        pkVar4 = (pkVar4->pointers).le_next;
      } while (pkVar4 != (kvtree_elem_struct *)0x0);
    }
    if ((int)uVar2 == 1) {
      if (pkVar3->lh_first != (kvtree_elem_struct *)0x0) {
        return pkVar3->lh_first->key;
      }
    }
    else {
      kvtree_err("Hash for key %s expected to have exactly one element, but it has %d @ %s:%d",key,
                 uVar2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x3ac);
    }
  }
  return (char *)0x0;
}

Assistant:

char* kvtree_get_val(const kvtree* hash, const char* key)
{
  char* value = NULL;

  /* check whether the specified key is even set */
  kvtree* key_hash = kvtree_get(hash, key);
  if (key_hash != NULL) {
    /* check that the size of this hash belonging to the key is
     * exactly 1 */
    int size = kvtree_size(key_hash);
    if (size == 1) {
      /* get the key of the first element in this hash */
      kvtree_elem* first = kvtree_elem_first(key_hash);
      value = kvtree_elem_key(first);
    } else {
      /* this is an error */
      kvtree_err("Hash for key %s expected to have exactly one element, but it has %d @ %s:%d",
        key, size, __FILE__, __LINE__
      );
    }
  }

  return value;
}